

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Copter.h
# Opt level: O2

void __thiscall chrono::copter::Copter<6>::ControlIncremental(Copter<6> *this,double *inputs)

{
  double dVar1;
  pointer psVar2;
  undefined8 uVar3;
  bool bVar4;
  long lVar5;
  double dVar6;
  undefined1 auVar7 [16];
  
  dVar1 = this->rps_max;
  psVar2 = (this->speeds).
           super__Vector_base<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (lVar5 = 0; lVar5 != 0x30; lVar5 = lVar5 + 8) {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(double *)((long)this->u_p + lVar5) + *(double *)((long)inputs + lVar5);
    uVar3 = vcmpsd_avx512f(auVar7,ZEXT816(0xbff0000000000000),1);
    bVar4 = (bool)((byte)uVar3 & 1);
    auVar7 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar7);
    dVar6 = (double)((ulong)bVar4 * -0x4010000000000000 + (ulong)!bVar4 * auVar7._0_8_);
    *(double *)((long)this->u_p + lVar5) = dVar6;
    *(double *)
     (*(long *)((long)&(psVar2->
                       super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr + lVar5 * 2) + 8) = dVar6 * dVar1 * 6.283185307179586;
  }
  return;
}

Assistant:

void Copter<nop>::ControlIncremental(double inputs[nop]) {
    for (int i = 0; i < nop; i++) {
        u_p[i] = ChClamp(u_p[i] + inputs[i], -1.0, 1.0);
        speeds[i]->Set_yconst(u_p[i] * rps_max * CH_C_2PI);
    }
}